

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void TR_Cond(ast *node,C_OP *lt,C_OP *lf)

{
  bool bVar1;
  ast *paVar2;
  Operand *__return_storage_ptr__;
  Operand *lt_00;
  Operand t1;
  undefined1 local_190 [152];
  Operand t2;
  Operand label1;
  
  t1.kind = 0;
  t1.value._M_dataplus._M_p = (pointer)&t1.value.field_2;
  t1.value._M_string_length = 0;
  bVar1 = false;
  t1.value.field_2._M_local_buf[0] = '\0';
  t1.active = -1;
  t2.kind = 0;
  t2.value._M_dataplus._M_p = (pointer)&t2.value.field_2;
  t2.value._M_string_length = 0;
  t2.value.field_2._M_local_buf[0] = '\0';
  t2.active = -1;
  switch(node->type) {
  case 0x107:
    IrSim::newTmpVar((Operand *)local_190,&irSim);
    Operand::operator=(&t1,(Operand *)local_190);
    std::__cxx11::string::~string((string *)(local_190 + 8));
    IrSim::newTmpVar((Operand *)local_190,&irSim);
    Operand::operator=(&t2,(Operand *)local_190);
    std::__cxx11::string::~string((string *)(local_190 + 8));
    paVar2 = sibling(node,-1);
    TR_Exp(paVar2,&t1);
    paVar2 = sibling(node,1);
    TR_Exp(paVar2,&t2);
    IrSim::icIfGoto((InterCode *)local_190,&irSim,node,lt,&t1,&t2);
    IrSim::commitIc(&irSim,(C_IC *)local_190);
    IrSim::icGoto((InterCode *)&label1,&irSim,lf);
    IrSim::commitIc(&irSim,(C_IC *)&label1);
    break;
  default:
    IrSim::newTmpVar((Operand *)local_190,&irSim);
    Operand::operator=(&t1,(Operand *)local_190);
    std::__cxx11::string::~string((string *)(local_190 + 8));
    TR_Exp(node,&t1);
    IrSim::icBinOp((InterCode *)local_190,&irSim,0x15,lt,&t1,&OP_ZERO);
    IrSim::commitIc(&irSim,(C_IC *)local_190);
    IrSim::icGoto((InterCode *)&label1,&irSim,lf);
    IrSim::commitIc(&irSim,(C_IC *)&label1);
    break;
  case 0x10c:
    bVar1 = true;
  case 0x10d:
    __return_storage_ptr__ = &label1;
    IrSim::newLabel(__return_storage_ptr__,&irSim);
    if (bVar1) {
      paVar2 = sibling(node,-1);
      __return_storage_ptr__ = lf;
      lt_00 = &label1;
    }
    else {
      paVar2 = sibling(node,-1);
      lt_00 = lt;
    }
    TR_Cond(paVar2,lt_00,__return_storage_ptr__);
    IrSim::icLabel((InterCode *)local_190,&irSim,&label1);
    IrSim::commitIc(&irSim,(C_IC *)local_190);
    InterCode::~InterCode((InterCode *)local_190);
    paVar2 = sibling(node,1);
    TR_Cond(paVar2,lt,lf);
    std::__cxx11::string::~string((string *)&label1.value);
    goto LAB_0010b080;
  case 0x10f:
    paVar2 = sibling(node,1);
    TR_Cond(paVar2,lf,lt);
    goto LAB_0010b080;
  }
  InterCode::~InterCode((InterCode *)&label1);
  InterCode::~InterCode((InterCode *)local_190);
LAB_0010b080:
  std::__cxx11::string::~string((string *)&t2.value);
  std::__cxx11::string::~string((string *)&t1.value);
  return;
}

Assistant:

static void TR_Cond(ast *node, C_OP &lt, C_OP &lf) {
    Operand t1, t2;
    switch (node->type) {
        case NOT:
            TR_Cond(sibling(node, 1), lf, lt);
            break;
        case OR: // no break
            TR_AND_OR(node, lt, lf, false);
            break;
        case AND:
            TR_AND_OR(node, lt, lf, true);
            break;
        case RELOP:
            t1 = irSim.newTmpVar();
            t2 = irSim.newTmpVar();
            TR_Exp(sibling(node, -1), t1);
            TR_Exp(sibling(node, 1), t2);
            irSim << irSim.icIfGoto(node, lt, t1, t2) << irSim.icGoto(lf);
            break;
        default:
            t1 = irSim.newTmpVar();
            TR_Exp(node, t1);
            irSim << irSim.icIfGoto(IC_NE, lt, t1, OP_ZERO) << irSim.icGoto(lf);
    }
}